

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickpool.hpp
# Opt level: O0

void __thiscall quickpool::ThreadPool::set_thread_affinity(ThreadPool *this)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference this_00;
  native_handle_type __th;
  runtime_error *this_01;
  int rc;
  size_t __cpu;
  size_t id;
  vector<unsigned_long,_std::allocator<unsigned_long>_> avail_cores;
  cpu_set_t cpuset;
  ThreadPool *this_local;
  
  sched::get_avail_cores();
  __cpu = 0;
  while( true ) {
    sVar3 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->workers_);
    if (sVar3 <= __cpu) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&id);
      return;
    }
    memset(&avail_cores.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,0,0x80);
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&id);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&id,__cpu % sVar3);
    uVar1 = *pvVar4;
    if (uVar1 >> 3 < 0x80) {
      cpuset.__bits[(uVar1 >> 6) - 1] = 1L << ((byte)uVar1 & 0x3f) | cpuset.__bits[(uVar1 >> 6) - 1]
      ;
    }
    this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::at(&this->workers_,__cpu);
    __th = std::thread::native_handle(this_00);
    iVar2 = pthread_setaffinity_np
                      (__th,0x80,
                       (cpu_set_t *)
                       &avail_cores.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (iVar2 != 0) break;
    __cpu = __cpu + 1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Error calling pthread_setaffinity_np");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_thread_affinity()
    {
        cpu_set_t cpuset;
        auto avail_cores = sched::get_avail_cores();
        for (size_t id = 0; id < workers_.size(); id++) {
            CPU_ZERO(&cpuset);
            CPU_SET(avail_cores[id % avail_cores.size()], &cpuset);
            int rc = pthread_setaffinity_np(
              workers_.at(id).native_handle(), sizeof(cpu_set_t), &cpuset);
            if (rc != 0) {
                throw std::runtime_error(
                  "Error calling pthread_setaffinity_np");
            }
        }
    }